

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::CompareEdgeDirections(S2Point *a0,S2Point *a1,S2Point *b0,S2Point *b1)

{
  S2Point *this;
  bool bVar1;
  ostream *poVar2;
  Vector3_xf local_238;
  Vector3_xf local_208;
  Vector3_xf local_1d8;
  Vector3_xf local_1a8;
  Vector3_ld local_178;
  Vector3_ld local_148;
  Vector3_ld local_118;
  Vector3_ld local_e8;
  int local_b0;
  byte local_a9;
  int sign;
  S2LogMessageVoidify local_91;
  D local_90;
  byte local_61;
  S2LogMessage local_60;
  S2LogMessageVoidify local_49;
  D local_48;
  S2Point *local_30;
  S2Point *b1_local;
  S2Point *b0_local;
  S2Point *a1_local;
  S2Point *a0_local;
  
  local_30 = b1;
  b1_local = b0;
  b0_local = a1;
  a1_local = a0;
  util::math::internal_vector::operator-(&local_48,a1);
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)a0,&local_48);
  local_61 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,799,kFatal,(ostream *)&std::cerr);
    local_61 = 1;
    poVar2 = S2LogMessage::stream(&local_60);
    poVar2 = std::operator<<(poVar2,"Check failed: (a0) != (-a1) ");
    S2LogMessageVoidify::operator&(&local_49,poVar2);
  }
  this = b1_local;
  if ((local_61 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
  }
  util::math::internal_vector::operator-(&local_90,local_30);
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                    ((BasicVector<Vector3,_double,_3UL> *)this,&local_90);
  local_a9 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&sign,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,800,kFatal,(ostream *)&std::cerr);
    local_a9 = 1;
    poVar2 = S2LogMessage::stream((S2LogMessage *)&sign);
    poVar2 = std::operator<<(poVar2,"Check failed: (b0) != (-b1) ");
    S2LogMessageVoidify::operator&(&local_91,poVar2);
  }
  if ((local_a9 & 1) == 0) {
    local_b0 = TriageCompareEdgeDirections<double>(a1_local,b0_local,b1_local,local_30);
    a0_local._4_4_ = local_b0;
    if (local_b0 == 0) {
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)a1_local,b0_local);
      if ((bVar1) ||
         (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                            ((BasicVector<Vector3,_double,_3UL> *)b1_local,local_30), bVar1)) {
        a0_local._4_4_ = 0;
      }
      else {
        ToLD(&local_e8,a1_local);
        ToLD(&local_118,b0_local);
        ToLD(&local_148,b1_local);
        ToLD(&local_178,local_30);
        local_b0 = TriageCompareEdgeDirections<long_double>
                             (&local_e8,&local_118,&local_148,&local_178);
        a0_local._4_4_ = local_b0;
        if (local_b0 == 0) {
          ToExact(&local_1a8,a1_local);
          ToExact(&local_1d8,b0_local);
          ToExact(&local_208,b1_local);
          ToExact(&local_238,local_30);
          a0_local._4_4_ = ExactCompareEdgeDirections(&local_1a8,&local_1d8,&local_208,&local_238);
          Vector3<ExactFloat>::~Vector3(&local_238);
          Vector3<ExactFloat>::~Vector3(&local_208);
          Vector3<ExactFloat>::~Vector3(&local_1d8);
          Vector3<ExactFloat>::~Vector3(&local_1a8);
        }
      }
    }
    return a0_local._4_4_;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&sign);
}

Assistant:

int CompareEdgeDirections(const S2Point& a0, const S2Point& a1,
                          const S2Point& b0, const S2Point& b1) {
  // Check that no edge consists of antipodal points.  (This catches the most
  // common case -- the full test is in ExactCompareEdgeDirections.)
  S2_DCHECK_NE(a0, -a1);
  S2_DCHECK_NE(b0, -b1);

  int sign = TriageCompareEdgeDirections(a0, a1, b0, b1);
  if (sign != 0) return sign;

  // Optimization for the case where either edge is degenerate.
  if (a0 == a1 || b0 == b1) return 0;

  sign = TriageCompareEdgeDirections(ToLD(a0), ToLD(a1), ToLD(b0), ToLD(b1));
  if (sign != 0) return sign;
  return ExactCompareEdgeDirections(ToExact(a0), ToExact(a1),
                                    ToExact(b0), ToExact(b1));
}